

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::
linkedList<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
          (Earcut<unsigned_int> *this,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *points,
          bool clockwise)

{
  double *pdVar1;
  pointer paVar2;
  Node *last;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  
  paVar2 = (points->
           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(points->
                super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 3;
  lVar4 = lVar5 + -1;
  if (lVar5 == 0) {
    lVar4 = 0;
  }
  dVar7 = 0.0;
  lVar6 = 0;
  while (lVar3 = lVar6, lVar5 != lVar3) {
    dVar7 = dVar7 + ((double)paVar2[lVar4]._M_elems[1] + (double)paVar2[lVar3]._M_elems[1]) *
                    ((double)paVar2[lVar4]._M_elems[0] - (double)paVar2[lVar3]._M_elems[0]);
    lVar4 = lVar3;
    lVar6 = lVar3 + 1;
  }
  if (dVar7 <= 0.0 == clockwise) {
    last = (Node *)0x0;
    lVar4 = lVar5 * 8;
    lVar6 = lVar5;
    while( true ) {
      lVar6 = lVar6 + -1;
      if (lVar6 == -1) break;
      last = insertNode<std::array<float,2ul>>
                       (this,this->vertices + lVar6,
                        (array<float,_2UL> *)
                        ((long)(points->
                               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[-1]._M_elems + lVar4),last
                       );
      lVar4 = lVar4 + -8;
    }
  }
  else {
    lVar6 = 0;
    last = (Node *)0x0;
    for (lVar4 = 0; lVar5 != lVar4; lVar4 = lVar4 + 1) {
      last = insertNode<std::array<float,2ul>>
                       (this,this->vertices + lVar4,
                        (array<float,_2UL> *)
                        ((long)((points->
                                super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar6),last)
      ;
      lVar6 = lVar6 + 8;
    }
  }
  if (last == (Node *)0x0) {
    last = (Node *)0x0;
  }
  else {
    pdVar1 = &last->next->x;
    if ((((last->x == *pdVar1) && (!NAN(last->x) && !NAN(*pdVar1))) &&
        (pdVar1 = &last->next->y, last->y == *pdVar1)) && (!NAN(last->y) && !NAN(*pdVar1))) {
      removeNode(this,last);
      last = last->next;
    }
  }
  this->vertices = this->vertices + lVar5;
  return last;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::linkedList(const Ring& points, const bool clockwise) {
    using Point = typename Ring::value_type;
    double sum = 0;
    const std::size_t len = points.size();
    std::size_t i, j;
    Node* last = nullptr;

    // calculate original winding order of a polygon ring
    for (i = 0, j = len > 0 ? len - 1 : 0; i < len; j = i++) {
        const auto& p1 = points[i];
        const auto& p2 = points[j];
        const double p20 = util::nth<0, Point>::get(p2);
        const double p10 = util::nth<0, Point>::get(p1);
        const double p11 = util::nth<1, Point>::get(p1);
        const double p21 = util::nth<1, Point>::get(p2);
        sum += (p20 - p10) * (p11 + p21);
    }

    // link points into circular doubly-linked list in the specified winding order
    if (clockwise == (sum > 0)) {
        for (i = 0; i < len; i++) last = insertNode(vertices + i, points[i], last);
    } else {
        for (i = len; i-- > 0;) last = insertNode(vertices + i, points[i], last);
    }

    if (last && equals(last, last->next)) {
        removeNode(last);
        last = last->next;
    }

    vertices += len;

    return last;
}